

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O1

void __thiscall TypeChecker::visit(TypeChecker *this,UnaryNode *node)

{
  ExpressionNode *pEVar1;
  _Optional_payload_base<TypeName> _Var2;
  mapped_type *__rhs;
  long *plVar3;
  size_type *psVar4;
  optional<TypeName> termType;
  TypeChecker checker;
  _Optional_payload_base<TypeName> local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined **local_30;
  _Storage<TypeName,_true> local_28;
  uint uStack_24;
  SymbolTable *local_20;
  
  local_20 = this->symbols_;
  local_30 = &PTR__Visitor_00156e60;
  uStack_24 = uStack_24 & 0xffffff00;
  pEVar1 = (node->term_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar1->super_Node)._vptr_Node + 0x10))(pEVar1,&local_30);
  _Var2._4_4_ = uStack_24;
  _Var2._M_payload._M_value = local_28._M_value;
  local_78._M_engaged = SUB41(uStack_24,0);
  if ((local_78._M_engaged == true) && (local_28._M_value != F32)) {
    local_78 = _Var2;
    __rhs = std::__detail::
            _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&TypeNameStrings_abi_cxx11_,(key_type *)&local_78);
    std::operator+(&local_50,"Invalid operation on value of type ",__rhs);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70._M_dataplus._M_p = (pointer)*plVar3;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_70._M_dataplus._M_p == psVar4) {
      local_70.field_2._M_allocated_capacity = *psVar4;
      local_70.field_2._8_8_ = plVar3[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar4;
    }
    local_70._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    reportError(&local_70,(Node *)node);
  }
  (this->type_).super__Optional_base<TypeName,_true,_true>._M_payload.
  super__Optional_payload_base<TypeName> = _Var2;
  return;
}

Assistant:

void TypeChecker::visit(const UnaryNode& node)
{
  TypeChecker checker{symbols_};
  node.getTerm().accept(checker);
  auto termType = checker.getType();
  if(termType.has_value() && termType != TypeName::F32)
    reportError("Invalid operation on value of type " + 
      TypeNameStrings.at(termType.value()) + "!", node);
  
  type_ = termType;
}